

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

int __thiscall
embree::SceneLoadingTutorialApplication::main
          (SceneLoadingTutorialApplication *this,int argc,char **argv)

{
  CommandLineOption **ppCVar1;
  Application *pAVar2;
  ulong uVar3;
  pointer pRVar4;
  bool bVar5;
  __type_conflict _Var6;
  byte bVar7;
  size_type sVar8;
  ostream *poVar9;
  void *this_00;
  runtime_error *this_01;
  CommandLineParser *pCVar10;
  Application *in_RDI;
  double dVar11;
  exception *e;
  Ref<embree::SceneGraph::PerspectiveCameraNode> cam_1;
  Ref<embree::SceneGraph::PerspectiveCameraNode> cam;
  Ref<embree::SceneGraph::GroupNode> flattened_scene;
  SceneGraphOperations *op;
  iterator __end2_1;
  iterator __begin2_1;
  vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
  *__range2_1;
  size_t i;
  FileName *file;
  iterator __end3;
  iterator __begin3;
  vector<embree::FileName,_std::allocator<embree::FileName>_> *__range3;
  function<void_()> *f;
  iterator __end2;
  iterator __begin2;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range2;
  exception *e_1;
  undefined4 in_stack_fffffffffffff448;
  int in_stack_fffffffffffff44c;
  Application *in_stack_fffffffffffff450;
  GroupNode *in_stack_fffffffffffff458;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffff460;
  TutorialScene *in_stack_fffffffffffff468;
  TutorialApplication *in_stack_fffffffffffff470;
  FileName *in_stack_fffffffffffff488;
  string *in_stack_fffffffffffff498;
  int *piVar12;
  undefined7 in_stack_fffffffffffff4a0;
  undefined1 in_stack_fffffffffffff4a7;
  GroupNode *in_stack_fffffffffffff4a8;
  float prop;
  GroupNode *in_stack_fffffffffffff4b0;
  InstancingMode mode;
  undefined7 in_stack_fffffffffffff4b8;
  undefined1 in_stack_fffffffffffff4bf;
  long **in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c8;
  int in_stack_fffffffffffff4cc;
  TutorialApplication *in_stack_fffffffffffff4d0;
  undefined7 in_stack_fffffffffffff4f0;
  undefined1 in_stack_fffffffffffff4f7;
  TutorialScene *in_stack_fffffffffffff4f8;
  undefined8 in_stack_fffffffffffff5c0;
  FileName *in_stack_fffffffffffff5c8;
  allocator *paVar13;
  FileName *in_stack_fffffffffffff750;
  allocator local_889;
  string local_888 [32];
  PerspectiveCameraData local_868;
  Camera local_828;
  long *local_7e0;
  undefined1 local_7d8 [32];
  undefined8 in_stack_fffffffffffff848;
  Camera local_798;
  long *local_758;
  undefined4 local_750;
  allocator local_749;
  string local_748 [32];
  long *local_728;
  long *local_720 [24];
  allocator local_659;
  string local_658 [32];
  pointer local_638;
  long *local_630;
  pointer local_628 [24];
  allocator local_561;
  string local_560 [32];
  pointer local_540;
  reference local_538;
  SceneGraphOperations *local_530;
  __normal_iterator<embree::SceneLoadingTutorialApplication::SceneGraphOperations_*,_std::vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>_>
  local_528;
  pointer *local_520;
  pointer local_518 [24];
  long *local_458;
  string local_450 [32];
  long *local_430;
  allocator local_421;
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  ulong local_3c0;
  allocator local_3b1;
  string local_3b0 [32];
  long *local_390;
  string local_388 [32];
  long *local_368;
  allocator local_359;
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  reference local_2f8;
  FileName *local_2f0;
  __normal_iterator<embree::FileName_*,_std::vector<embree::FileName,_std::allocator<embree::FileName>_>_>
  local_2e8;
  Verbosity *local_2e0;
  reference local_2d8;
  function<void_()> *local_2d0;
  __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  local_2c8;
  _Rb_tree_header *local_2c0;
  allocator local_2b1;
  string local_2b0 [84];
  int local_25c;
  long **local_258;
  long **local_248;
  pointer *local_238;
  long **local_228;
  long **local_218;
  long **local_208;
  long **local_200;
  long **local_1f8;
  long **local_1f0;
  long **local_1e8;
  CommandLineParser *local_1e0;
  CommandLineParser *local_1d8;
  CommandLineParser *local_1d0;
  CommandLineParser *local_1c8;
  CommandLineParser *local_1c0;
  CommandLineParser *local_1b8;
  CommandLineParser *local_1b0;
  CommandLineParser *local_1a8;
  CommandLineParser *local_1a0;
  CommandLineParser *local_198;
  CommandLineParser *local_190;
  CommandLineParser *local_188;
  CommandLineParser *local_180;
  CommandLineParser *local_178;
  CommandLineParser *local_170;
  CommandLineParser *local_168;
  long **local_160;
  long **local_150;
  long **local_140;
  long **local_130;
  pointer *local_120;
  pointer *local_110;
  pointer *local_100;
  long **local_f0;
  long **local_e0;
  long **local_d8;
  CommandLineParser *local_d0;
  pointer *local_c8;
  CommandLineParser *local_c0;
  pointer *local_b8;
  CommandLineParser *local_b0;
  pointer *local_a8;
  CommandLineParser *local_a0;
  pointer *local_98;
  long **local_90;
  long **local_88;
  pointer local_80;
  CommandLineParser *local_78;
  long *local_70;
  long **local_68;
  long **local_60;
  int *local_58;
  long **local_50;
  int *local_48;
  pointer local_40;
  pointer *local_38;
  pointer local_30;
  pointer *local_28;
  pointer local_20;
  pointer *local_18;
  long **local_8;
  
  Application::parseCommandLine
            (in_stack_fffffffffffff450,in_stack_fffffffffffff44c,(char **)0x141072);
  (*in_RDI->_vptr_Application[3])();
  TutorialApplication::create_device((TutorialApplication *)0x141156);
  paVar13 = &local_2b1;
  std::allocator<char>::allocator();
  dVar11 = (double)std::__cxx11::string::string(local_2b0,"application start",paVar13);
  Application::log(in_RDI,dVar11);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  local_2c0 = &in_RDI[5].commandLineParser.commandLineOptionMap._M_t._M_impl.super__Rb_tree_header;
  local_2c8._M_current =
       (function<void_()> *)
       std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::begin
                 ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                  CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
  local_2d0 = (function<void_()> *)
              std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::end
                        ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                         )CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                             *)in_stack_fffffffffffff450,
                            (__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448)), bVar5
        ) {
    local_2d8 = __gnu_cxx::
                __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                ::operator*(&local_2c8);
    std::function<void_()>::operator()((function<void_()> *)in_stack_fffffffffffff450);
    __gnu_cxx::
    __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::operator++(&local_2c8);
  }
  sVar8 = std::vector<embree::FileName,_std::allocator<embree::FileName>_>::size
                    ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)
                     &in_RDI[5].commandLineParser.verbosity);
  if (sVar8 != 0) {
    local_2e0 = &in_RDI[5].commandLineParser.verbosity;
    local_2e8._M_current =
         (FileName *)
         std::vector<embree::FileName,_std::allocator<embree::FileName>_>::begin
                   ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)
                    CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
    local_2f0 = (FileName *)
                std::vector<embree::FileName,_std::allocator<embree::FileName>_>::end
                          ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)
                           CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
    while (bVar5 = __gnu_cxx::operator!=
                             ((__normal_iterator<embree::FileName_*,_std::vector<embree::FileName,_std::allocator<embree::FileName>_>_>
                               *)in_stack_fffffffffffff450,
                              (__normal_iterator<embree::FileName_*,_std::vector<embree::FileName,_std::allocator<embree::FileName>_>_>
                               *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448)),
          bVar5) {
      local_2f8 = __gnu_cxx::
                  __normal_iterator<embree::FileName_*,_std::vector<embree::FileName,_std::allocator<embree::FileName>_>_>
                  ::operator*(&local_2e8);
      embree::FileName::ext_abi_cxx11_(in_stack_fffffffffffff488);
      toLowerCase(in_stack_fffffffffffff498);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"obj",&local_359);
      _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff470,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff468);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::string::~string(local_338);
      if (_Var6) {
        local_168 = &in_RDI[5].commandLineParser;
        std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff450,
                        (char *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
        loadOBJ(in_stack_fffffffffffff5c8,SUB81((ulong)in_stack_fffffffffffff5c0 >> 0x38,0),
                SUB81((ulong)in_stack_fffffffffffff5c0 >> 0x30,0));
        SceneGraph::GroupNode::add
                  (in_stack_fffffffffffff458,
                   (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff450);
        local_160 = &local_368;
        if (local_368 != (long *)0x0) {
          (**(code **)(*local_368 + 0x18))();
        }
      }
      else {
        embree::FileName::ext_abi_cxx11_(in_stack_fffffffffffff488);
        bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff450,
                                (char *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448
                                                ));
        std::__cxx11::string::~string(local_388);
        if (bVar5) {
          local_170 = &in_RDI[5].commandLineParser;
          SceneGraph::load(in_stack_fffffffffffff750,SUB81((ulong)paVar13 >> 0x38,0));
          SceneGraph::GroupNode::add
                    (in_stack_fffffffffffff458,
                     (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff450);
          local_150 = &local_390;
          if (local_390 != (long *)0x0) {
            (**(code **)(*local_390 + 0x18))();
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<embree::FileName_*,_std::vector<embree::FileName,_std::allocator<embree::FileName>_>_>
      ::operator++(&local_2e8);
    }
  }
  pAVar2 = Application::instance;
  std::allocator<char>::allocator();
  dVar11 = (double)std::__cxx11::string::string(local_3b0,"loading scene done",&local_3b1);
  Application::log(pAVar2,dVar11);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  for (local_3c0 = 0; uVar3 = local_3c0,
      sVar8 = std::vector<embree::FileName,_std::allocator<embree::FileName>_>::size
                        ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)
                         &in_RDI[5].last_time), uVar3 < sVar8; local_3c0 = local_3c0 + 1) {
    if (0 < in_RDI->verbosity) {
      std::operator<<((ostream *)&std::cout,"Adding [");
      std::vector<embree::FileName,_std::allocator<embree::FileName>_>::operator[]
                ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)&in_RDI[5].last_time
                 ,local_3c0);
      poVar9 = embree::operator<<((ostream *)in_stack_fffffffffffff450,
                                  (FileName *)
                                  CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
      poVar9 = std::operator<<(poVar9,"] to scene...");
      std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
    }
    std::vector<embree::FileName,_std::allocator<embree::FileName>_>::operator[]
              ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)&in_RDI[5].last_time,
               local_3c0);
    embree::FileName::ext_abi_cxx11_(in_stack_fffffffffffff488);
    toLowerCase(in_stack_fffffffffffff498);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,"obj",&local_421);
    _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff470,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff468);
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string(local_400);
    if (_Var6) {
      local_178 = &in_RDI[5].commandLineParser;
      std::vector<embree::FileName,_std::allocator<embree::FileName>_>::operator[]
                ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)&in_RDI[5].last_time
                 ,local_3c0);
      std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff450,
                      (char *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
      loadOBJ(in_stack_fffffffffffff5c8,SUB81((ulong)in_stack_fffffffffffff5c0 >> 0x38,0),
              SUB81((ulong)in_stack_fffffffffffff5c0 >> 0x30,0));
      SceneGraph::GroupNode::add
                (in_stack_fffffffffffff458,
                 (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff450);
      local_140 = &local_430;
      if (local_430 != (long *)0x0) {
        (**(code **)(*local_430 + 0x18))();
      }
    }
    else {
      std::vector<embree::FileName,_std::allocator<embree::FileName>_>::operator[]
                ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)&in_RDI[5].last_time
                 ,local_3c0);
      embree::FileName::ext_abi_cxx11_(in_stack_fffffffffffff488);
      bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff450,
                              (char *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448))
      ;
      std::__cxx11::string::~string(local_450);
      if (bVar5) {
        local_180 = &in_RDI[5].commandLineParser;
        std::vector<embree::FileName,_std::allocator<embree::FileName>_>::operator[]
                  ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)
                   &in_RDI[5].last_time,local_3c0);
        SceneGraph::load(in_stack_fffffffffffff750,SUB81((ulong)paVar13 >> 0x38,0));
        SceneGraph::GroupNode::add
                  (in_stack_fffffffffffff458,
                   (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff450);
        local_130 = &local_458;
        if (local_458 != (long *)0x0) {
          (**(code **)(*local_458 + 0x18))();
        }
      }
    }
    if (0 < in_RDI->verbosity) {
      poVar9 = std::operator<<((ostream *)&std::cout," [DONE]");
      this_00 = (void *)std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
    }
  }
  Texture::clearTextureCache();
  if ((in_RDI[5].commandLineParser.commandLineOptionMap._M_t._M_impl.super__Rb_tree_header.
       _M_node_count & 0x100000000) != 0) {
    local_188 = &in_RDI[5].commandLineParser;
    SceneGraph::GroupNode::remove_mblur(in_stack_fffffffffffff4a8,(bool)in_stack_fffffffffffff4a7);
  }
  if ((in_RDI[5].commandLineParser.commandLineOptionMap._M_t._M_impl.super__Rb_tree_header.
       _M_node_count & 0x10000000000) != 0) {
    local_190 = &in_RDI[5].commandLineParser;
    SceneGraph::GroupNode::remove_mblur(in_stack_fffffffffffff4a8,(bool)in_stack_fffffffffffff4a7);
  }
  sVar8 = std::
          vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
          ::size((vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
                  *)&in_RDI[5].commandLineParser.commandLineOptionList.
                     super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if ((sVar8 != 0) && (0 < in_RDI->verbosity)) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,"scene statistics (pre-convert):");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    local_b0 = &in_RDI[5].commandLineParser;
    local_a8 = local_518;
    local_40 = (local_b0->commandLineOptionList).
               super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_38 = local_518;
    local_518[0] = local_40;
    if (local_40 != (pointer)0x0) {
      (**(code **)&local_40->ptr->description)();
    }
    SceneGraph::calculateStatistics(in_stack_fffffffffffff460);
    SceneGraph::Statistics::print
              ((Statistics *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0));
    local_120 = local_518;
    if (local_518[0] != (pointer)0x0) {
      (*(code *)(local_518[0]->ptr->description)._M_string_length)();
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  local_520 = &in_RDI[5].commandLineParser.commandLineOptionList.
               super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_528._M_current =
       (SceneGraphOperations *)
       std::
       vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
       ::begin((vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
                *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
  local_530 = (SceneGraphOperations *)
              std::
              vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
              ::end((vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
                     *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<embree::SceneLoadingTutorialApplication::SceneGraphOperations_*,_std::vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>_>
                             *)in_stack_fffffffffffff450,
                            (__normal_iterator<embree::SceneLoadingTutorialApplication::SceneGraphOperations_*,_std::vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>_>
                             *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448)),
        pAVar2 = Application::instance, bVar5) {
    local_538 = __gnu_cxx::
                __normal_iterator<embree::SceneLoadingTutorialApplication::SceneGraphOperations_*,_std::vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>_>
                ::operator*(&local_528);
    prop = (float)((ulong)in_stack_fffffffffffff4a8 >> 0x20);
    switch(*local_538) {
    case CONVERT_TRIANGLES_TO_QUADS:
      local_198 = &in_RDI[5].commandLineParser;
      SceneGraph::GroupNode::triangles_to_quads(in_stack_fffffffffffff4b0,prop);
      break;
    case CONVERT_BEZIER_TO_LINES:
      local_1a0 = &in_RDI[5].commandLineParser;
      SceneGraph::GroupNode::bezier_to_lines(in_stack_fffffffffffff4b0);
      break;
    case CONVERT_BEZIER_TO_BSPLINE:
      local_1a8 = &in_RDI[5].commandLineParser;
      SceneGraph::GroupNode::bezier_to_bspline(in_stack_fffffffffffff4b0);
      break;
    case CONVERT_BEZIER_TO_HERMITE:
      local_1b8 = &in_RDI[5].commandLineParser;
      SceneGraph::GroupNode::bezier_to_hermite(in_stack_fffffffffffff4b0);
      break;
    case CONVERT_BSPLINE_TO_BEZIER:
      local_1b0 = &in_RDI[5].commandLineParser;
      SceneGraph::GroupNode::bspline_to_bezier(in_stack_fffffffffffff4b0);
      break;
    case CONVERT_FLAT_TO_ROUND_CURVES:
      local_1c0 = &in_RDI[5].commandLineParser;
      SceneGraph::GroupNode::flat_to_round_curves(in_stack_fffffffffffff4b0);
      break;
    case CONVERT_ROUND_TO_FLAT_CURVES:
      local_1c8 = &in_RDI[5].commandLineParser;
      SceneGraph::GroupNode::round_to_flat_curves(in_stack_fffffffffffff4b0);
      break;
    case MERGE_QUADS_TO_GRIDS:
      local_1d0 = &in_RDI[5].commandLineParser;
      SceneGraph::GroupNode::merge_quads_to_grids(in_stack_fffffffffffff4b0);
      break;
    case CONVERT_QUADS_TO_GRIDS:
      local_1d8 = &in_RDI[5].commandLineParser;
      SceneGraph::GroupNode::quads_to_grids
                (in_stack_fffffffffffff4b0,(uint)prop,(uint)in_stack_fffffffffffff4a8);
      break;
    case CONVERT_GRIDS_TO_QUADS:
      local_1e0 = &in_RDI[5].commandLineParser;
      SceneGraph::GroupNode::grids_to_quads(in_stack_fffffffffffff4b0);
      break;
    case CONVERT_MBLUR_TO_NONMBLUR:
      local_c0 = &in_RDI[5].commandLineParser;
      local_b8 = &local_540;
      local_30 = (local_c0->commandLineOptionList).
                 super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_28 = &local_540;
      pRVar4 = local_30;
      if (local_30 != (pointer)0x0) {
        ppCVar1 = &local_540->ptr;
        local_540 = local_30;
        (**(code **)&(*ppCVar1)->description)();
        pRVar4 = local_540;
      }
      local_540 = pRVar4;
      SceneGraph::convert_mblur_to_nonmblur
                ((Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff848);
      local_110 = &local_540;
      if (local_540 != (pointer)0x0) {
        (*(code *)(local_540->ptr->description)._M_string_length)();
      }
      break;
    default:
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"unsupported scene graph operation");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __gnu_cxx::
    __normal_iterator<embree::SceneLoadingTutorialApplication::SceneGraphOperations_*,_std::vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>_>
    ::operator++(&local_528);
  }
  std::allocator<char>::allocator();
  mode = (InstancingMode)((ulong)in_stack_fffffffffffff4b0 >> 0x20);
  dVar11 = (double)std::__cxx11::string::string(local_560,"converting scene done",&local_561);
  Application::log(pAVar2,dVar11);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  if (0 < in_RDI->verbosity) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,"scene statistics (pre-flattening):");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    local_d0 = &in_RDI[5].commandLineParser;
    local_c8 = local_628;
    local_20 = (local_d0->commandLineOptionList).
               super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_18 = local_628;
    local_628[0] = local_20;
    if (local_20 != (pointer)0x0) {
      (**(code **)&local_20->ptr->description)();
    }
    SceneGraph::calculateStatistics(in_stack_fffffffffffff460);
    SceneGraph::Statistics::print
              ((Statistics *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0));
    local_100 = local_628;
    if (local_628[0] != (pointer)0x0) {
      (*(code *)(local_628[0]->ptr->description)._M_string_length)();
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  local_a0 = &in_RDI[5].commandLineParser;
  local_98 = &local_638;
  local_638 = (local_a0->commandLineOptionList).
              super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  if (local_638 != (pointer)0x0) {
    (**(code **)&local_638->ptr->description)();
  }
  SceneGraph::flatten((Ref<embree::SceneGraph::GroupNode> *)
                      CONCAT17(in_stack_fffffffffffff4bf,in_stack_fffffffffffff4b8),mode);
  local_238 = &local_638;
  if (local_638 != (pointer)0x0) {
    (*(code *)(local_638->ptr->description)._M_string_length)();
  }
  pAVar2 = Application::instance;
  std::allocator<char>::allocator();
  dVar11 = (double)std::__cxx11::string::string(local_658,"flattening scene done",&local_659);
  Application::log(pAVar2,dVar11);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  if (0 < in_RDI->verbosity) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<((ostream *)&std::cout,"scene statistics (post-flattening):");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    local_d8 = local_720;
    local_e0 = &local_630;
    local_8 = local_720;
    local_720[0] = local_630;
    if (local_630 != (long *)0x0) {
      (**(code **)(*local_630 + 0x10))();
    }
    SceneGraph::calculateStatistics(in_stack_fffffffffffff460);
    SceneGraph::Statistics::print
              ((Statistics *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0));
    local_f0 = local_720;
    if (local_720[0] != (long *)0x0) {
      (**(code **)(*local_720[0] + 0x18))();
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  local_88 = &local_728;
  local_90 = &local_630;
  local_728 = local_630;
  if (local_630 != (long *)0x0) {
    (**(code **)(*local_630 + 0x10))();
  }
  TutorialScene::add(in_stack_fffffffffffff4f8,
                     (Ref<embree::SceneGraph::GroupNode> *)
                     CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0));
  local_228 = &local_728;
  if (local_728 != (long *)0x0) {
    (**(code **)(*local_728 + 0x18))();
  }
  local_68 = &local_630;
  local_70 = (long *)0x0;
  if (local_630 != (long *)0x0) {
    (**(code **)(*local_630 + 0x18))();
  }
  local_630 = local_70;
  pCVar10 = &in_RDI[5].commandLineParser;
  local_80 = (pointer)0x0;
  local_78 = pCVar10;
  if ((pCVar10->commandLineOptionList).
      super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)(((pCVar10->commandLineOptionList).
                super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->ptr->description)._M_string_length)();
  }
  (pCVar10->commandLineOptionList).
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_80;
  pAVar2 = Application::instance;
  std::allocator<char>::allocator();
  dVar11 = (double)std::__cxx11::string::string
                             (local_748,"populating tutorial scene done",&local_749);
  Application::log(pAVar2,dVar11);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  if ((in_RDI[6].verbosity & 1) == 0) {
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff450,
                            (char *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
    if (bVar5) {
      TutorialScene::getCamera
                ((TutorialScene *)in_stack_fffffffffffff4d0,
                 (string *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      local_1e8 = &local_758;
      (**(code **)(*local_758 + 0x80))(0,local_7d8);
      Camera::Camera(&local_798,(PerspectiveCameraData *)local_7d8,
                     *(Handedness *)
                      ((long)&in_RDI[1].commandLineParser.commandLineOptionMap._M_t._M_impl.
                              super__Rb_tree_header._M_header._M_right + 4));
      Camera::operator=((Camera *)
                        &in_RDI[1].commandLineParser.commandLineOptionList.
                         super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_798);
      local_1f0 = &local_758;
      bVar7 = (**(code **)(*local_758 + 0x78))();
      if ((bVar7 & 1) != 0) {
        in_stack_fffffffffffff4d0 = (TutorialApplication *)&in_RDI[1].verbosity;
        local_50 = &local_758;
        local_48 = (int *)in_stack_fffffffffffff4d0;
        if (local_758 != (long *)0x0) {
          (**(code **)(*local_758 + 0x10))();
        }
        if ((((_Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               *)&(in_stack_fffffffffffff4d0->super_Application)._vptr_Application)->_M_impl).
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)(((((_Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                         *)&(in_stack_fffffffffffff4d0->super_Application)._vptr_Application)->
                      _M_impl).super__Vector_impl_data._M_start)->ptr->super_Node).fileName.
                    _M_string_length)();
        }
        (((_Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
           *)&(in_stack_fffffffffffff4d0->super_Application)._vptr_Application)->_M_impl).
        super__Vector_impl_data._M_start = (pointer)*local_50;
      }
      in_stack_fffffffffffff4c0 = &local_758;
      local_258 = in_stack_fffffffffffff4c0;
      if (local_758 != (long *)0x0) {
        (**(code **)(*local_758 + 0x18))();
      }
    }
    else if ((in_RDI[2].commandLineParser.verbosity & SILENT) == NORMAL) {
      TutorialScene::getDefaultCamera(in_stack_fffffffffffff468);
      local_208 = &local_7e0;
      if (local_7e0 != (long *)0x0) {
        local_1f8 = &local_7e0;
        (**(code **)(*local_7e0 + 0x80))(0,&local_868);
        Camera::Camera(&local_828,&local_868,
                       *(Handedness *)
                        ((long)&in_RDI[1].commandLineParser.commandLineOptionMap._M_t._M_impl.
                                super__Rb_tree_header._M_header._M_right + 4));
        Camera::operator=((Camera *)
                          &in_RDI[1].commandLineParser.commandLineOptionList.
                           super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_828);
        local_200 = &local_7e0;
        bVar7 = (**(code **)(*local_7e0 + 0x78))();
        if ((bVar7 & 1) != 0) {
          piVar12 = &in_RDI[1].verbosity;
          local_60 = &local_7e0;
          local_58 = piVar12;
          if (local_7e0 != (long *)0x0) {
            (**(code **)(*local_7e0 + 0x10))();
          }
          if (*(long *)piVar12 != 0) {
            (**(code **)(**(long **)piVar12 + 0x18))();
          }
          *(long **)piVar12 = *local_60;
        }
      }
      local_248 = &local_7e0;
      if (local_7e0 != (long *)0x0) {
        (**(code **)(*local_7e0 + 0x18))();
      }
    }
    TutorialApplication::set_scene(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    pAVar2 = Application::instance;
    std::allocator<char>::allocator();
    dVar11 = (double)std::__cxx11::string::string
                               (local_888,"creating ISPC compatible scene done",&local_889);
    Application::log(pAVar2,dVar11);
    std::__cxx11::string::~string(local_888);
    std::allocator<char>::~allocator((allocator<char> *)&local_889);
    TutorialApplication::run
              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4cc,
               (char **)in_stack_fffffffffffff4c0);
  }
  else {
    TutorialScene::print_camera_names(in_stack_fffffffffffff468);
  }
  local_25c = 0;
  local_750 = 1;
  local_218 = &local_630;
  if (local_630 != (long *)0x0) {
    (**(code **)(*local_630 + 0x18))();
  }
  return local_25c;
}

Assistant:

int SceneLoadingTutorialApplication::main(int argc, char** argv) try
  {
    /* parse command line options */
    parseCommandLine(argc,argv);

    /* callback */
    try {
      postParseCommandLine();
    }
    catch (const std::exception& e) {
      std::cout << "Error: " << e.what() << std::endl;
    }

    /* create embree device */
    create_device();
    
    log(1,"application start");

    /* execute postponed scene graph operations */
    for (auto& f : futures) f();
    
    /* load scene */
    if (sceneFilename.size())
    {
      for (auto& file : sceneFilename)
      {
        if (toLowerCase(file.ext()) == std::string("obj"))
          scene->add(loadOBJ(file,subdiv_mode != ""));
        else if (file.ext() != "")
          scene->add(SceneGraph::load(file));
      }
    }

    Application::instance->log(1,"loading scene done");

    /* load key frames for animation */
    for (size_t i=0; i<keyFramesFilenames.size(); i++)
    {
      if (verbosity >= 1) 
        std::cout << "Adding ["<< keyFramesFilenames[i] << "] to scene..." << std::flush;
      
      if (toLowerCase(keyFramesFilenames[i].ext()) == std::string("obj"))
        scene->add(loadOBJ(keyFramesFilenames[i],subdiv_mode != "",true));
      else if (keyFramesFilenames[i].ext() != "")
        scene->add(SceneGraph::load(keyFramesFilenames[i]));
      
      if (verbosity >= 1) 
        std::cout << " [DONE]" << std::endl << std::flush;
    }

    /* clear texture cache */
    Texture::clearTextureCache();

    /* perform removals */
    if (remove_mblur)     scene->remove_mblur(true);
    if (remove_non_mblur) scene->remove_mblur(false);

    /* perform conversions */
    if (sgop.size() && verbosity >= 1) {
      std::cout << std::endl;
      std::cout << "scene statistics (pre-convert):" << std::endl;
      SceneGraph::calculateStatistics(scene.dynamicCast<SceneGraph::Node>()).print();
      std::cout << std::endl;
    }

    /* perform scene graph conversions */
    for (auto& op : sgop)
    {
      switch (op) {
      case CONVERT_TRIANGLES_TO_QUADS   : scene->triangles_to_quads(convert_tris_to_quads_prop); break;
      case CONVERT_BEZIER_TO_LINES      : scene->bezier_to_lines(); break;
      case CONVERT_BEZIER_TO_BSPLINE    : scene->bezier_to_bspline(); break;
      case CONVERT_BSPLINE_TO_BEZIER    : scene->bspline_to_bezier(); break;
      case CONVERT_BEZIER_TO_HERMITE    : scene->bezier_to_hermite(); break;
      case CONVERT_FLAT_TO_ROUND_CURVES : scene->flat_to_round_curves(); break;
      case CONVERT_ROUND_TO_FLAT_CURVES : scene->round_to_flat_curves(); break;
      case MERGE_QUADS_TO_GRIDS         : scene->merge_quads_to_grids(); break;
      case CONVERT_QUADS_TO_GRIDS       : scene->quads_to_grids(grid_resX,grid_resY); break;
      case CONVERT_GRIDS_TO_QUADS       : scene->grids_to_quads(); break;
      case CONVERT_MBLUR_TO_NONMBLUR    : convert_mblur_to_nonmblur(scene.dynamicCast<SceneGraph::Node>()); break;
      default : throw std::runtime_error("unsupported scene graph operation");
      }
    }
    Application::instance->log(1,"converting scene done");

    if (verbosity >= 1) {
      std::cout << std::endl;
      std::cout << "scene statistics (pre-flattening):" << std::endl;
      SceneGraph::calculateStatistics(scene.dynamicCast<SceneGraph::Node>()).print();
      std::cout << std::endl;
    }
    
    Ref<SceneGraph::GroupNode> flattened_scene = SceneGraph::flatten(scene,instancing_mode);
    Application::instance->log(1,"flattening scene done");

    if (verbosity >= 1) {
      std::cout << std::endl;
      std::cout << "scene statistics (post-flattening):" << std::endl;
      SceneGraph::calculateStatistics(flattened_scene.dynamicCast<SceneGraph::Node>()).print();
      std::cout << std::endl;
    }

    /* convert model */
    obj_scene.add(flattened_scene);
    flattened_scene = nullptr;
    scene = nullptr;
    Application::instance->log(1,"populating tutorial scene done");
    
    /* print all cameras */
    if (print_scene_cameras) {
      obj_scene.print_camera_names();
      return 0;
    }

    /* use specified camera */
    if (camera_name != "") {
      auto cam = obj_scene.getCamera(camera_name);
      camera = Camera(cam->get(0),camera.handedness);
      if (cam->isAnimated()) animated_camera = cam;
    }

    /* otherwise use default camera */
    else if (!command_line_camera) {
      auto cam = obj_scene.getDefaultCamera();
      if (cam) {
        camera = Camera(cam->get(0),camera.handedness);
        if (cam->isAnimated()) animated_camera = cam;
      }
    }

    /* send model */
    set_scene(&obj_scene);
    Application::instance->log(1,"creating ISPC compatible scene done");

    /* start tutorial */
    run(argc,argv);

    return 0;
  }
  catch (const std::exception& e) {
    std::cout << "Error: " << e.what() << std::endl;
    return 1;
  }
  catch (...) {
    std::cout << "Error: unknown exception caught." << std::endl;
    return 1;
  }